

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O0

void __thiscall
visitor_test_should_parse_utc_time_with_microseconds_Test::TestBody
          (visitor_test_should_parse_utc_time_with_microseconds_Test *this)

{
  bool bVar1;
  size_t size;
  char *pcVar2;
  int *piVar3;
  time_t *__timer;
  AssertHelper local_168;
  Message local_160;
  int local_154;
  _Optional_payload_base<int> local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_4;
  Message local_130;
  int local_124;
  _Optional_payload_base<int> local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_3;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_b0;
  Message local_a8 [3];
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  tm tm;
  time_t local_38;
  time_t t;
  Time time;
  char *str;
  visitor_test_should_parse_utc_time_with_microseconds_Test *this_local;
  
  time.m_usec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)((long)"20171105-14:09:30.125456" + 9);
  size = strlen("14:09:30.125456");
  __timer = (time_t *)0x167b28d;
  Fixpp::details::LexicalCast<Fixpp::Type::UTCTimeOnly>::cast((Time *)&t,"14:09:30.125456",size);
  local_38 = Fixpp::Type::UTCTimeOnly::Time::time((Time *)&t,__timer);
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_hour = 0;
  tm.tm_mday = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_gmtoff = 0;
  gmtime_r(&local_38,(tm *)&gtest_ar.message_);
  local_8c = 0xe;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_88,"tm.tm_hour","14",&tm.tm_sec,&local_8c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x27a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(local_a8);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_cc = 9;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_c8,"tm.tm_min","9",
               (int *)((long)&gtest_ar.message_.ptr_ + 4),&local_cc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x27b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_d8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_f4 = 0x1e;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_f0,"tm.tm_sec","30",(int *)&gtest_ar.message_,&local_f4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x27c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_100);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_120 = (_Optional_payload_base<int>)Fixpp::Type::UTCTimeOnly::Time::msec((Time *)&t);
        piVar3 = std::optional<int>::value((optional<int> *)&local_120);
        local_124 = 0x7d;
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_118,"time.msec().value()","125",piVar3,&local_124);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_130);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x27e,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_130);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_130);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          local_150 = (_Optional_payload_base<int>)Fixpp::Type::UTCTimeOnly::Time::usec((Time *)&t);
          piVar3 = std::optional<int>::value((optional<int> *)&local_150);
          local_154 = 0x1c8;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_148,"time.usec().value()","456",piVar3,&local_154);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
          if (!bVar1) {
            testing::Message::Message(&local_160);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
            testing::internal::AssertHelper::AssertHelper
                      (&local_168,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                       ,0x27f,pcVar2);
            testing::internal::AssertHelper::operator=(&local_168,&local_160);
            testing::internal::AssertHelper::~AssertHelper(&local_168);
            testing::Message::~Message(&local_160);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(visitor_test, should_parse_utc_time_with_microseconds)
{
    const char* str = "14:09:30.125456";
    auto time = Fixpp::details::LexicalCast<Fixpp::Type::UTCTimeOnly>::cast(str, std::strlen(str));

    auto t = time.time();
    std::tm tm{};
    gmtime_r(&t, &tm);

    ASSERT_EQ(tm.tm_hour, 14);
    ASSERT_EQ(tm.tm_min, 9);
    ASSERT_EQ(tm.tm_sec, 30);

    ASSERT_EQ(time.msec().value(), 125);
    ASSERT_EQ(time.usec().value(), 456);
}